

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_socket.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::udp_socket::wrap
          (udp_socket *this,char *hostname,int port,span<const_char> p,error_code *ec,
          udp_send_flags_t flags)

{
  bool bVar1;
  unsigned_long *puVar2;
  pointer data;
  pointer pvVar3;
  unsigned_long size;
  reference pvVar4;
  char *data_00;
  size_t sVar5;
  element_type *this_00;
  bool local_1fd;
  endpoint local_1ec;
  endpoint_type local_1d0;
  undefined1 local_1b3;
  uchar local_1b2;
  bitfield_flag local_1b1;
  undefined1 local_1b0 [8];
  set_dont_frag df;
  size_t local_198;
  const_buffer local_190;
  undefined1 local_180 [8];
  array<boost::asio::const_buffer,_2UL> iovec;
  size_t local_158;
  size_t local_150;
  size_t hostlen;
  char *h;
  array<char,_255UL> header;
  error_code *ec_local;
  int port_local;
  char *hostname_local;
  udp_socket *this_local;
  undefined1 auStack_18 [7];
  udp_send_flags_t flags_local;
  span<const_char> p_local;
  
  _auStack_18 = p.m_ptr;
  header._M_elems._247_8_ = ec;
  hostlen = (size_t)::std::array<char,_255UL>::data((array<char,_255UL> *)((long)&h + 1));
  write_uint16<int,char*>(0,(char **)&hostlen);
  write_uint8<int,char*>(0,(char **)&hostlen);
  write_uint8<int,char*>(3,(char **)&hostlen);
  local_158 = strlen(hostname);
  iovec._M_elems[1].size_ = 0xf8;
  puVar2 = ::std::min<unsigned_long>(&local_158,&iovec._M_elems[1].size_);
  local_150 = *puVar2;
  write_uint8<unsigned_long,char*>(local_150,(char **)&hostlen);
  memcpy((void *)hostlen,hostname,local_150);
  hostlen = local_150 + hostlen;
  write_uint16<int,char*>(port,(char **)&hostlen);
  ::std::array<boost::asio::const_buffer,_2UL>::array
            ((array<boost::asio::const_buffer,_2UL> *)local_180);
  data = ::std::array<char,_255UL>::data((array<char,_255UL> *)((long)&h + 1));
  sVar5 = hostlen;
  pvVar3 = ::std::array<char,_255UL>::data((array<char,_255UL> *)((long)&h + 1));
  size = numeric_cast<unsigned_long,long,void>(sVar5 - (long)pvVar3);
  boost::asio::const_buffer::const_buffer(&local_190,data,size);
  pvVar4 = ::std::array<boost::asio::const_buffer,_2UL>::operator[]
                     ((array<boost::asio::const_buffer,_2UL> *)local_180,0);
  pvVar4->data_ = local_190.data_;
  pvVar4->size_ = local_190.size_;
  data_00 = span<const_char>::data((span<const_char> *)auStack_18);
  sVar5 = span<const_char>::size((span<const_char> *)auStack_18);
  boost::asio::const_buffer::const_buffer((const_buffer *)&df.m_df,data_00,sVar5);
  pvVar4 = ::std::array<boost::asio::const_buffer,_2UL>::operator[]
                     ((array<boost::asio::const_buffer,_2UL> *)local_180,1);
  pvVar4->data_ = (void *)df._8_8_;
  pvVar4->size_ = local_198;
  local_1b2 = flags.m_val;
  local_1b3 = 8;
  local_1b1 = (bitfield_flag)
              libtorrent::flags::operator&
                        ((bitfield_flag<unsigned_char,_libtorrent::aux::udp_send_flags_tag,_void>)
                         flags.m_val,
                         (bitfield_flag<unsigned_char,_libtorrent::aux::udp_send_flags_tag,_void>)
                         0x8);
  bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_1b1);
  local_1fd = false;
  if (bVar1) {
    boost::asio::
    basic_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
    ::local_endpoint(&local_1d0,
                     (basic_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                      *)this,(error_code *)header._M_elems._247_8_);
    local_1fd = is_v4<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>(&local_1d0);
  }
  set_dont_frag::set_dont_frag((set_dont_frag *)local_1b0,&this->m_socket,local_1fd);
  this_00 = ::std::
            __shared_ptr_access<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->m_socks5_connection);
  socks5::target(&local_1ec,this_00);
  boost::asio::
  basic_datagram_socket<boost::asio::ip::udp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
  ::send_to<std::array<boost::asio::const_buffer,2ul>>
            ((basic_datagram_socket<boost::asio::ip::udp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
              *)this,(array<boost::asio::const_buffer,_2UL> *)local_180,&local_1ec,0,
             (error_code *)header._M_elems._247_8_);
  set_dont_frag::~set_dont_frag((set_dont_frag *)local_1b0);
  return;
}

Assistant:

void udp_socket::wrap(char const* hostname, int const port, span<char const> p
	, error_code& ec, udp_send_flags_t const flags)
{
	using namespace libtorrent::aux;

	std::array<char, max_header_size> header;
	char* h = header.data();

	write_uint16(0, h); // reserved
	write_uint8(0, h); // fragment
	write_uint8(3, h); // atyp
	std::size_t const hostlen = std::min(std::strlen(hostname), max_header_size - 7);
	write_uint8(hostlen, h); // hostname len
	std::memcpy(h, hostname, hostlen);
	h += hostlen;
	write_uint16(port, h);

	std::array<boost::asio::const_buffer, 2> iovec;
	iovec[0] = boost::asio::const_buffer(header.data(), aux::numeric_cast<std::size_t>(h - header.data()));
	iovec[1] = boost::asio::const_buffer(p.data(), static_cast<std::size_t>(p.size()));

	// set the DF flag for the socket and clear it again in the destructor
	set_dont_frag df(m_socket, (flags & dont_fragment)
		&& aux::is_v4(m_socket.local_endpoint(ec)));

	m_socket.send_to(iovec, m_socks5_connection->target(), 0, ec);
}